

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O3

void __thiscall Refal2::CLeftPartCompiler::matchRightParens(CLeftPartCompiler *this)

{
  CNodeType *fromNode;
  CNodeType *toNode;
  CHoleNode *this_00;
  CNodeList<Refal2::CUnit> local_50;
  CHole local_38;
  
  COperationsBuilder::AddMatchRightParens((COperationsBuilder *)this);
  this_00 = this->hole;
  fromNode = (this_00->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.first;
  toNode = ((((this_00->super_CHole).super_CUnitList.super_CNodeList<Refal2::CUnit>.last)->
            super_CUnit).field_1.pairedParen)->prev;
  local_50.first = (CNodeType *)0x0;
  local_50.last = (CNodeType *)0x0;
  local_50._vptr_CNodeList = (_func_int **)&PTR__CNodeList_00148c78;
  if (toNode != (CNodeType *)0x0) {
    CNodeList<Refal2::CUnit>::Detach((CNodeList<Refal2::CUnit> *)this_00,fromNode,toNode);
    CNodeList<Refal2::CUnit>::Assign(&local_50,fromNode,toNode);
    this_00 = this->hole;
  }
  CNodeList<Refal2::CUnit>::RemoveFirst((CNodeList<Refal2::CUnit> *)this_00);
  CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  local_38.super_CUnitList.super_CNodeList<Refal2::CUnit>.last = local_50.last;
  local_38.super_CUnitList.super_CNodeList<Refal2::CUnit>.first = local_50.first;
  local_38.left = this->top;
  local_38.super_CUnitList.super_CNodeList<Refal2::CUnit>._vptr_CNodeList =
       (_func_int **)&PTR__CNodeList_00148978;
  local_38.right = local_38.left + 1;
  local_50.first = (CNodeType *)0x0;
  local_50.last = (CNodeType *)0x0;
  CNodeList<Refal2::CHole>::InsertBefore(&this->holes,this->hole,&local_38);
  CNodeList<Refal2::CUnit>::~CNodeList((CNodeList<Refal2::CUnit> *)&local_38);
  this->top = this->top + 2;
  CNodeList<Refal2::CUnit>::~CNodeList(&local_50);
  return;
}

Assistant:

void CLeftPartCompiler::matchRightParens()
{
	COperationsBuilder::AddMatchRightParens();
	
	CUnitNode* begin = hole->GetFirst();
	CUnitNode* end = hole->GetLast();
	CUnitNode* beginNew = 0;
	CUnitNode* endNew = end->PairedParen()->Prev();
	
	CUnitList newHole;
	if( endNew != 0 ) {
		beginNew = begin;
		hole->Detach( beginNew, endNew );
		newHole.Assign( beginNew, endNew );
	}
	
	hole->RemoveFirst();
	hole->RemoveLast();

	holes.InsertBefore( hole, CHole( newHole, top, top + 1 ) );
	top += 2;
}